

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

cmTarget * __thiscall
cmMakefile::AddExecutable
          (cmMakefile *this,string *exeName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *srcs,bool excludeFromAll)

{
  bool bVar1;
  cmTarget *this_00;
  char *val;
  undefined3 in_register_00000009;
  string local_48;
  
  this_00 = AddNewTarget(this,EXECUTABLE,exeName);
  if (CONCAT31(in_register_00000009,excludeFromAll) == 0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"EXCLUDE_FROM_ALL","");
    val = GetProperty(this,&local_48);
    bVar1 = cmSystemTools::IsOn(val);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (!bVar1) goto LAB_002eda5b;
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"EXCLUDE_FROM_ALL","");
  cmTarget::SetProperty(this_00,&local_48,"TRUE");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
LAB_002eda5b:
  cmTarget::AddSources(this_00,srcs);
  AddGlobalLinkInformation(this,this_00);
  return this_00;
}

Assistant:

cmTarget* cmMakefile::AddExecutable(const std::string& exeName,
                                    const std::vector<std::string>& srcs,
                                    bool excludeFromAll)
{
  cmTarget* target = this->AddNewTarget(cmStateEnums::EXECUTABLE, exeName);
  if (excludeFromAll || this->GetPropertyAsBool("EXCLUDE_FROM_ALL")) {
    target->SetProperty("EXCLUDE_FROM_ALL", "TRUE");
  }
  target->AddSources(srcs);
  this->AddGlobalLinkInformation(*target);
  return target;
}